

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O0

void x509_pubkey_changed(X509_PUBKEY *pub)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  CBS cbs;
  EVP_PKEY *pkey;
  uint8_t *puStack_18;
  int spki_len;
  uint8_t *spki;
  X509_PUBKEY *pub_local;
  
  spki = (uint8_t *)pub;
  EVP_PKEY_free((EVP_PKEY *)pub->pkey);
  spki[0x10] = '\0';
  spki[0x11] = '\0';
  spki[0x12] = '\0';
  spki[0x13] = '\0';
  spki[0x14] = '\0';
  spki[0x15] = '\0';
  spki[0x16] = '\0';
  spki[0x17] = '\0';
  puStack_18 = (uint8_t *)0x0;
  iVar1 = i2d_X509_PUBKEY((X509_PUBKEY *)spki,&stack0xffffffffffffffe8);
  if (-1 < iVar1) {
    CBS_init((CBS *)local_38,puStack_18,(long)iVar1);
    cbs.len = (size_t)EVP_parse_public_key((CBS *)local_38);
    if (((EVP_PKEY *)cbs.len == (EVP_PKEY *)0x0) || (sVar2 = CBS_len((CBS *)local_38), sVar2 != 0))
    {
      EVP_PKEY_free((EVP_PKEY *)cbs.len);
    }
    else {
      *(size_t *)(spki + 0x10) = cbs.len;
    }
  }
  OPENSSL_free(puStack_18);
  ERR_clear_error();
  return;
}

Assistant:

static void x509_pubkey_changed(X509_PUBKEY *pub) {
  EVP_PKEY_free(pub->pkey);
  pub->pkey = NULL;

  // Re-encode the |X509_PUBKEY| to DER and parse it with EVP's APIs.
  uint8_t *spki = NULL;
  int spki_len = i2d_X509_PUBKEY(pub, &spki);
  EVP_PKEY *pkey;
  if (spki_len < 0) {
    goto err;
  }

  CBS cbs;
  CBS_init(&cbs, spki, (size_t)spki_len);
  pkey = EVP_parse_public_key(&cbs);
  if (pkey == NULL || CBS_len(&cbs) != 0) {
    EVP_PKEY_free(pkey);
    goto err;
  }

  pub->pkey = pkey;

err:
  OPENSSL_free(spki);
  // If the operation failed, clear errors. An |X509_PUBKEY| whose key we cannot
  // parse is still a valid SPKI. It just cannot be converted to an |EVP_PKEY|.
  ERR_clear_error();
}